

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cpp
# Opt level: O2

size_t pe_util::forwarderNameLen(char *fPtr,size_t bufSize)

{
  char c;
  bool bVar1;
  bool bVar2;
  size_t sVar3;
  size_t sVar4;
  bool bVar5;
  
  if (bufSize == 0 || fPtr == (char *)0x0) {
    sVar4 = 0;
  }
  else {
    bVar5 = false;
    sVar3 = 0;
    do {
      c = fPtr[sVar3];
      bVar1 = true;
      if ((c != '.') && (bVar2 = _isFuncChar(c), sVar4 = sVar3, bVar1 = bVar5, !bVar2)) break;
      bVar5 = bVar1;
      sVar3 = sVar3 + 1;
      sVar4 = bufSize;
    } while (bufSize != sVar3);
    if (!bVar5) {
      sVar4 = 0;
    }
    if (c != '\0') {
      sVar4 = 0;
    }
  }
  return sVar4;
}

Assistant:

size_t pe_util::forwarderNameLen(const char* fPtr, size_t bufSize)
{
    if (!fPtr || bufSize == 0) return 0;
    
    // names can be also mangled, i.e. MSVCRT.??0__non_rtti_object@std@@QAE@ABV01@@Z
    bool has_dot = false;
    size_t len = 0;
    while ((*fPtr == '.') || _isFuncChar(*fPtr))
    {
        if (*fPtr == '.') has_dot = true;
        len++;
        if ((--bufSize) == 0) break;
        fPtr++;
    }
    if (*fPtr == '\0') {
        if (!has_dot) {
            return 0; //this is not a valid forwarder
        }
        return len;
    }
    return 0;
}